

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O3

ProgressData * __thiscall
duckdb::PhysicalWindow::GetProgress
          (ProgressData *__return_storage_ptr__,PhysicalWindow *this,ClientContext *context,
          GlobalSourceState *gsource_p)

{
  __pthread_internal_list *p_Var1;
  ulong uVar2;
  pointer pWVar3;
  double dVar4;
  double dVar5;
  
  p_Var1 = gsource_p[2].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list
           .__prev;
  pWVar3 = unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>,_true>
           ::operator->((unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>,_true>
                         *)(*(long *)&gsource_p[1].super_StateWithBlockableTasks + 0x68));
  uVar2 = (pWVar3->super_PartitionGlobalSinkState).count.super___atomic_base<unsigned_long>._M_i;
  __return_storage_ptr__->invalid = false;
  if (uVar2 == 0) {
    __return_storage_ptr__->invalid = true;
    dVar4 = 0.0;
    dVar5 = 1.0;
  }
  else {
    dVar4 = ((double)((ulong)p_Var1 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
            (double)((ulong)p_Var1 & 0xffffffff | 0x4330000000000000);
    dVar5 = ((double)(uVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
            (double)(uVar2 & 0xffffffff | 0x4330000000000000);
  }
  __return_storage_ptr__->done = dVar4;
  __return_storage_ptr__->total = dVar5;
  return __return_storage_ptr__;
}

Assistant:

ProgressData PhysicalWindow::GetProgress(ClientContext &context, GlobalSourceState &gsource_p) const {
	auto &gsource = gsource_p.Cast<WindowGlobalSourceState>();
	const auto returned = gsource.returned.load();

	auto &gsink = gsource.gsink;
	const auto count = gsink.global_partition->count.load();
	ProgressData res;
	if (count) {
		res.done = double(returned);
		res.total = double(count);
	} else {
		res.SetInvalid();
	}
	return res;
}